

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O2

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_>::OrderElement
          (TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixTBBFlow<double>_> *this)

{
  int iVar1;
  TPZCompMesh *pTVar2;
  TPZCompEl *pTVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  TPZConnect *pTVar7;
  TPZCompEl **ppTVar8;
  int64_t iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  TPZVec<long> firstelconnect;
  TPZVec<long> elorderinv;
  TPZVec<long> elconnect;
  long local_a8;
  TPZVec<int> nodeorder;
  
  lVar10 = (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->fConnectVec).
           super_TPZChunkVector<TPZConnect,_10>.fNElements;
  TPZVec<long>::TPZVec(&firstelconnect,lVar10 + 1);
  *firstelconnect.fStore = 0;
  lVar13 = 0;
  if (lVar10 < 1) {
    lVar10 = lVar13;
  }
  lVar12 = 0;
  for (; lVar10 != lVar13; lVar13 = lVar13 + 1) {
    pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                         fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar13);
    iVar1 = pTVar7->fNElConnected;
    lVar11 = firstelconnect.fStore[lVar13];
    pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                         fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar13);
    lVar12 = lVar12 + iVar1;
    firstelconnect.fStore[lVar13 + 1] = lVar11 + pTVar7->fNElConnected;
  }
  nodeorder._vptr_TPZVec = (_func_int **)0xffffffffffffffff;
  TPZVec<long>::TPZVec(&elconnect,lVar12,(long *)&nodeorder);
  for (lVar13 = 0; pTVar2 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,
      lVar13 < (pTVar2->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
      lVar13 = lVar13 + 1) {
    ppTVar8 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        (&(pTVar2->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar13);
    pTVar3 = *ppTVar8;
    if (pTVar3 != (TPZCompEl *)0x0) {
      TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&nodeorder);
      (**(code **)(*(long *)pTVar3 + 0x1e0))(pTVar3,(TPZManVector<long,_10> *)&nodeorder);
      iVar9 = nodeorder.fNElements;
      if (nodeorder.fNElements < 1) {
        iVar9 = 0;
      }
      for (lVar12 = 0; iVar9 != lVar12; lVar12 = lVar12 + 1) {
        lVar11 = *(long *)(nodeorder.fStore + lVar12 * 2);
        elconnect.fStore[firstelconnect.fStore[lVar11]] = lVar13;
        firstelconnect.fStore[lVar11] = firstelconnect.fStore[lVar11] + 1;
      }
      TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&nodeorder);
    }
  }
  *firstelconnect.fStore = 0;
  for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
    lVar12 = firstelconnect.fStore[lVar13];
    pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                         fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar13);
    firstelconnect.fStore[lVar13 + 1] = lVar12 + pTVar7->fNElConnected;
  }
  nodeorder._vptr_TPZVec = (_func_int **)CONCAT44(nodeorder._vptr_TPZVec._4_4_,0xffffffff);
  TPZVec<int>::Resize(&this->fElementOrder,
                      (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                      fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements,
                      (int *)&nodeorder);
  nodeorder._vptr_TPZVec = (_func_int **)CONCAT44(nodeorder._vptr_TPZVec._4_4_,0xffffffff);
  TPZVec<int>::Fill(&this->fElementOrder,(int *)&nodeorder,0,-1);
  elorderinv._vptr_TPZVec._0_4_ = 0xffffffff;
  TPZVec<int>::TPZVec(&nodeorder,
                      (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                      fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements,
                      (int *)&elorderinv);
  *firstelconnect.fStore = 0;
  for (lVar13 = 0; lVar10 != lVar13; lVar13 = lVar13 + 1) {
    pTVar7 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->
                         fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar13);
    if (-1 < pTVar7->fSequenceNumber) {
      nodeorder.fStore[pTVar7->fSequenceNumber] = (int)lVar13;
    }
  }
  local_a8 = -1;
  TPZVec<long>::TPZVec
            (&elorderinv,
             (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->fElementVec).
             super_TPZChunkVector<TPZCompEl_*,_10>.fNElements,&local_a8);
  lVar12 = 0;
  for (lVar13 = 0; lVar13 != lVar10; lVar13 = lVar13 + 1) {
    lVar11 = (long)nodeorder.fStore[lVar13];
    if (lVar11 != -1) {
      lVar4 = firstelconnect.fStore[lVar11 + 1];
      for (lVar11 = firstelconnect.fStore[lVar11]; lVar11 < lVar4; lVar11 = lVar11 + 1) {
        lVar5 = elconnect.fStore[lVar11];
        if ((lVar5 != -1) && (elorderinv.fStore[lVar5] == -1)) {
          elorderinv.fStore[lVar5] = lVar12;
          lVar12 = lVar12 + 1;
        }
      }
    }
  }
  piVar6 = (this->fElementOrder).fStore;
  lVar10 = (((this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh)->fElementVec).
           super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  lVar13 = 0;
  if (lVar10 < 1) {
    lVar10 = lVar13;
  }
  for (; lVar10 != lVar13; lVar13 = lVar13 + 1) {
    if (elorderinv.fStore[lVar13] != -1) {
      piVar6[elorderinv.fStore[lVar13]] = (int)lVar13;
    }
  }
  TPZVec<long>::~TPZVec(&elorderinv);
  TPZVec<int>::~TPZVec(&nodeorder);
  TPZVec<long>::~TPZVec(&elconnect);
  TPZVec<long>::~TPZVec(&firstelconnect);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::OrderElement()//TPZVec<int> &elorder)
{
	int64_t numelconnected = 0;
	int64_t nconnect = this->fMesh->ConnectVec().NElements();
	int64_t ic;
	//firstelconnect contains the first element index in the elconnect vector
	TPZVec<int64_t> firstelconnect(nconnect+1);
	firstelconnect[0] = 0;
	for(ic=0; ic<nconnect; ic++) {
		numelconnected += this->fMesh->ConnectVec()[ic].NElConnected();
		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
	}
#ifdef PZDEBUG
    TPZVec<int64_t> firstel_copy(firstelconnect);
#endif
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<<"numelconnected " << numelconnected << endl;
		sout<< "firstelconnect "<< firstelconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//cout << "numelconnected " << numelconnected << endl;
	//cout << "firstelconnect ";
	//  for(ic=0; ic<nconnect; ic++) cout << firstelconnect[ic] << ' ';
  	TPZVec<int64_t> elconnect(numelconnected,-1);
  	int64_t el;
  	TPZCompEl *cel;
  	for(el=0; el<this->fMesh->ElementVec().NElements(); el++) {
  		cel = this->fMesh->ElementVec()[el];
  		if(!cel) continue;
  		TPZStack<int64_t> connectlist;
  		cel->BuildConnectList(connectlist);
  		int64_t nc = connectlist.NElements();
  		int64_t ic;
  		for(ic=0; ic<nc; ic++) {
  			int64_t cindex = connectlist[ic];
#ifdef PZDEBUG
            if(firstelconnect[cindex] >= firstel_copy[cindex+1])
            {
                std::cout << "firstelconnect " << firstelconnect << std::endl;
                std::cout << "firstel_copy " << firstel_copy << std::endl;
                DebugStop();
            }
#endif
  			elconnect[firstelconnect[cindex]] = el;
  			firstelconnect[cindex]++;
  		}
  	}
	//  for(ic=0; ic<numelconnected; ic++) cout << elconnect[ic] << endl;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout<< "elconnect "<< elconnect;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		firstelconnect[ic+1] = firstelconnect[ic]+this->fMesh->ConnectVec()[ic].NElConnected();
  	}
	//cout << "elconnect\n";
	//  int no;
	for(int64_t no=0; no< this->fMesh->ConnectVec().NElements(); no++) {
#ifdef PZ_LOG
        if (logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout<< "Node index " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		//cout << "no numero " << no << ' ' << " seq num " << this->fMesh->ConnectVec()[no].SequenceNumber() << ' ';
		//       for(ic=firstelconnect[no]; ic<firstelconnect[no+1];ic++) cout << elconnect[ic] << ' ';
		//cout << endl;
	}
	
	
  	fElementOrder.Resize(this->fMesh->ElementVec().NElements(),-1);
  	fElementOrder.Fill(-1);
  	TPZVec<int> nodeorder(this->fMesh->ConnectVec().NElements(),-1);
  	firstelconnect[0] = 0;
  	for(ic=0; ic<nconnect; ic++) {
  		int64_t seqnum = this->fMesh->ConnectVec()[ic].SequenceNumber();
  		if(seqnum >= 0) nodeorder[seqnum] = ic;
  	}
	//  cout << "nodeorder ";
	/*for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) cout << nodeorder[ic] << ' ';
	 cout << endl;
	 cout.flush();*/
  	int64_t seq;
  	int64_t elsequence = 0;
  	TPZVec<int64_t> elorderinv(this->fMesh->ElementVec().NElements(),-1);
  	for(seq=0; seq<nconnect; seq++) {
  		ic = nodeorder[seq];
  		if(ic == -1) continue;
  		int64_t firstind = firstelconnect[ic];
  		int64_t lastind = firstelconnect[ic+1];
  		int64_t ind;
  		for(ind=firstind; ind<lastind; ind++) {
  			el = elconnect[ind];
			if(el == -1) {
				continue;
			}
  			if(elorderinv[el]==-1) elorderinv[el] = elsequence++;
  		}
  	}
	//  cout << "elorderinv ";
	//  for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) cout << elorderinv[seq] << ' ';
	//  cout << endl;
  	elsequence = 0;
  	for(seq=0;seq<this->fMesh->ElementVec().NElements();seq++) {
  		if(elorderinv[seq] == -1) continue;
  		fElementOrder[elorderinv[seq]] = seq;
  	}
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
        sout << "element order " << fElementOrder << std::endl;
		sout<< "elorderinv " << elorderinv << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	//  cout << "elorder" << endl;
	//  for(ic=0; ic<this->fMesh->ElementVec().NElements(); ic++) cout << elorder[ic] << endl;
	
}